

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryCamerasLoader.cpp
# Opt level: O0

bool __thiscall COLLADASaxFWL::LibraryCamerasLoader::end__camera(LibraryCamerasLoader *this)

{
  uint uVar1;
  DocumentProcessor *in_RDI;
  bool success;
  int descriptionType;
  Camera *in_stack_ffffffffffffffd8;
  
  switch((*(byte *)&in_RDI->mCurrentSidTreeNode & 1) +
         (*(byte *)((long)&in_RDI->mCurrentSidTreeNode + 1) & 1) * '\x02' +
         (*(byte *)((long)&in_RDI->mCurrentSidTreeNode + 2) & 1) * '\x04') {
  case 1:
    COLLADAFW::Camera::setDescriptionType((Camera *)in_RDI->mColladaLoader,SINGLE_X);
    break;
  case 2:
    COLLADAFW::Camera::setDescriptionType((Camera *)in_RDI->mColladaLoader,SINGLE_Y);
    break;
  case 3:
    COLLADAFW::Camera::setDescriptionType((Camera *)in_RDI->mColladaLoader,X_AND_Y);
    break;
  default:
    COLLADAFW::Camera::setDescriptionType((Camera *)in_RDI->mColladaLoader,UNDEFINED);
    break;
  case 5:
    COLLADAFW::Camera::setDescriptionType((Camera *)in_RDI->mColladaLoader,ASPECTRATIO_AND_X);
    break;
  case 6:
    COLLADAFW::Camera::setDescriptionType((Camera *)in_RDI->mColladaLoader,ASPECTRATIO_AND_Y);
  }
  uVar1 = FilePartLoader::getObjectFlags((FilePartLoader *)0xb1a2f9);
  if ((uVar1 & 0x80) != 0) {
    (*(in_RDI->super_IFilePartLoader).super_ExtraDataLoader._vptr_ExtraDataLoader[2])();
    DocumentProcessor::addCamera(in_RDI,in_stack_ffffffffffffffd8);
  }
  resetCurrentValues((LibraryCamerasLoader *)in_RDI);
  (*(in_RDI->super_IFilePartLoader).super_ExtraDataLoader._vptr_ExtraDataLoader[2])();
  DocumentProcessor::moveUpInSidTree(in_RDI);
  return true;
}

Assistant:

bool LibraryCamerasLoader::end__camera()
	{
		// we need to determine the description type
		// X = 1, Y = 2, aspect ratio = 4
		int descriptionType = (mCurrentCameraHasX ? 1 : 0) +
							  (mCurrentCameraHasY ? 2 : 0) +
							  (mCurrentCameraHasAspectRatio ? 4 : 0);
		switch ( descriptionType )
		{
		case 1:
			mCurrentCamera->setDescriptionType(COLLADAFW::Camera::SINGLE_X);
			break;
		case 2:
			mCurrentCamera->setDescriptionType(COLLADAFW::Camera::SINGLE_Y);
			break;
		case 3:
			mCurrentCamera->setDescriptionType(COLLADAFW::Camera::X_AND_Y);
			break;
		case 5:
			mCurrentCamera->setDescriptionType(COLLADAFW::Camera::ASPECTRATIO_AND_X);
			break;
		case 6:
			mCurrentCamera->setDescriptionType(COLLADAFW::Camera::ASPECTRATIO_AND_Y);
			break;
		default:
			mCurrentCamera->setDescriptionType(COLLADAFW::Camera::UNDEFINED);
		}

		bool success = true;
		if ( (getObjectFlags() & Loader::CAMERA_FLAG) != 0 )
		{
			getFileLoader()->addCamera( mCurrentCamera );
		}
		resetCurrentValues();
		getFileLoader()->moveUpInSidTree();
		return success;
	}